

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::
     ParseUniformEnumProperty<tinyusdz::GeomSubset::FamilyType,tinyusdz::GeomSubset::FamilyType>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::GeomSubset::FamilyType> *enum_handler,Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType> *result,string *warn,
               string *err)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  value_type *value;
  Attribute *args;
  int iVar4;
  char *pcVar5;
  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType> *args_1;
  optional<tinyusdz::Token> tok;
  expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  ostringstream ss_e;
  allocator local_241;
  string *local_240;
  optional<tinyusdz::Token> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  string local_1c8;
  optional<tinyusdz::Token> local_1a8 [9];
  
  if (result == (TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x644);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[Internal error] `result` arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    goto joined_r0x001f3173;
  }
  args = attr;
  args_1 = result;
  local_240 = prop_name;
  bVar1 = Attribute::is_connection(attr);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x648);
    ::std::operator<<(poVar2," ");
    pcVar5 = 
    "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}";
  }
  else if (attr->_variability == Uniform) {
    bVar1 = Attribute::is_blocked(attr);
    if (bVar1) {
LAB_001f32ad:
      result->_blocked = true;
      return true;
    }
    bVar1 = primvar::PrimVar::is_timesamples(&attr->_var);
    if (!bVar1) {
      Attribute::get_value<tinyusdz::Token>(local_1a8,attr);
      nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                (&local_238,local_1a8);
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(local_1a8);
      if (local_238.has_value_ == true) {
        pbVar3 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_238)->str_;
        ::std::
        function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&local_1f0,enum_handler,pbVar3);
        if (local_1f0.contained.
            super_storage_t_impl<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value == true) {
LAB_001f347c:
          value = nonstd::expected_lite::
                  expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&local_1f0);
          TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>::operator=(result,value);
          goto LAB_001f39a6;
        }
        if (!strict_allowedToken_check) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar2 = ::std::operator<<((ostream *)local_1a8,"[warn]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
          poVar2 = ::std::operator<<(poVar2,"():");
          iVar4 = 0x660;
          goto LAB_001f38c5;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
        poVar2 = ::std::operator<<(poVar2,"():");
        iVar4 = 0x65e;
LAB_001f3730:
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar4);
        ::std::operator<<(poVar2," ");
        ::std::__cxx11::string::string
                  ((string *)&local_1c8,"Attribute `{}`: `{}` is not an allowed token.",&local_241);
        pbVar3 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_238)->str_;
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)&local_210,(fmt *)&local_1c8,local_240,pbVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_210);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+(&local_210,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_210);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        bVar1 = false;
LAB_001f39a8:
        nonstd::expected_lite::
        expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected(&local_1f0);
        goto LAB_001f39b2;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
      poVar2 = ::std::operator<<(poVar2,"():");
      iVar4 = 0x665;
      goto LAB_001f35d6;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x655);
    ::std::operator<<(poVar2," ");
    pcVar5 = "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.";
  }
  else {
    bVar1 = primvar::PrimVar::is_scalar(&attr->_var);
    if (bVar1) {
      bVar1 = Attribute::is_blocked(attr);
      if (bVar1) goto LAB_001f32ad;
      Attribute::get_value<tinyusdz::Token>(local_1a8,attr);
      nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                (&local_238,local_1a8);
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(local_1a8);
      if (local_238.has_value_ == true) {
        pbVar3 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_238)->str_;
        ::std::
        function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&local_1f0,enum_handler,pbVar3);
        if (local_1f0.contained.
            super_storage_t_impl<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value == true) goto LAB_001f347c;
        if (strict_allowedToken_check) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
          poVar2 = ::std::operator<<(poVar2,"():");
          iVar4 = 0x678;
          goto LAB_001f3730;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar2 = ::std::operator<<((ostream *)local_1a8,"[warn]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
        poVar2 = ::std::operator<<(poVar2,"():");
        iVar4 = 0x67a;
LAB_001f38c5:
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar4);
        ::std::operator<<(poVar2," ");
        ::std::__cxx11::string::string
                  ((string *)&local_1c8,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                   &local_241);
        pbVar3 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_238)->str_;
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)&local_210,(fmt *)&local_1c8,local_240,pbVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_210);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+(&local_210,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)warn,(string *)&local_210);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        result->_empty = true;
LAB_001f39a6:
        bVar1 = true;
        goto LAB_001f39a8;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
      poVar2 = ::std::operator<<(poVar2,"():");
      iVar4 = 0x67f;
LAB_001f35d6:
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,iVar4);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)&local_210,
                 "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                 ,&local_241);
      Attribute::type_name_abi_cxx11_(&local_1c8,attr);
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&local_1f0,(fmt *)&local_210,local_240,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_1f0);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1f0,&local_210,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_1f0);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      bVar1 = false;
LAB_001f39b2:
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_238);
      return bVar1;
    }
    bVar1 = primvar::PrimVar::is_timesamples(&attr->_var);
    if (bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x683);
      ::std::operator<<(poVar2," ");
      pcVar5 = "Attribute `{}` is uniform variability, but TimeSampled value is authored.";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseUniformEnumProperty");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x686);
      ::std::operator<<(poVar2," ");
      pcVar5 = "Internal error. Attribute `{}` is invalid";
    }
  }
  ::std::__cxx11::string::string((string *)&local_1f0,pcVar5,(allocator *)&local_210);
  fmt::format<std::__cxx11::string>
            ((string *)&local_238,(fmt *)&local_1f0,(string *)local_240,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_238);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
joined_r0x001f3173:
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
    ::std::__cxx11::string::operator=((string *)err,(string *)&local_238);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return false;
}

Assistant:

bool ParseUniformEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<T> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // uniform or TimeSamples
    if (attr.get_var().is_scalar()) {

      if (attr.is_blocked()) {
        result->set_blocked(true);
        return true;
      }

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          (*result) = e.value();
          return true;
        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          result->set_value_empty();
          return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    } else if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is uniform variability, but TimeSampled value is authored.",
 prop_name);

    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Attribute `{}` is invalid", prop_name);
    }

  }

  return false;
}